

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinGlobalSourceState::PrepareScanHT
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  type pJVar1;
  type this_00;
  idx_t iVar2;
  ulong uVar3;
  
  pJVar1 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator*(&sink->hash_table);
  this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&pJVar1->data_collection);
  this->full_outer_chunk_idx = 0;
  iVar2 = TupleDataCollection::ChunkCount(this_00);
  LOCK();
  (this->full_outer_chunk_count).super___atomic_base<unsigned_long>._M_i = iVar2;
  UNLOCK();
  LOCK();
  (this->full_outer_chunk_done).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  uVar3 = (((this->full_outer_chunk_count).super___atomic_base<unsigned_long>._M_i +
           sink->num_threads) - 1) / sink->num_threads;
  this->full_outer_chunks_per_thread = uVar3 + (uVar3 == 0);
  LOCK();
  (this->global_stage)._M_i = SCAN_HT;
  UNLOCK();
  return;
}

Assistant:

void HashJoinGlobalSourceState::PrepareScanHT(HashJoinGlobalSinkState &sink) {
	D_ASSERT(global_stage != HashJoinSourceStage::SCAN_HT);
	auto &ht = *sink.hash_table;

	auto &data_collection = ht.GetDataCollection();
	full_outer_chunk_idx = 0;
	full_outer_chunk_count = data_collection.ChunkCount();
	full_outer_chunk_done = 0;

	full_outer_chunks_per_thread =
	    MaxValue<idx_t>((full_outer_chunk_count + sink.num_threads - 1) / sink.num_threads, 1);

	global_stage = HashJoinSourceStage::SCAN_HT;
}